

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O2

lzma_ret stream_encode_mt(void *coder_ptr,lzma_allocator *allocator,uint8_t *in,size_t *in_pos,
                         size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,
                         lzma_action action)

{
  mythread_mutex *mutex;
  lzma_outq *outq;
  int *piVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  _Bool _Var6;
  int iVar7;
  lzma_ret lVar8;
  lzma_outbuf *plVar9;
  long lVar10;
  void *pvVar11;
  lzma_vli lVar12;
  uint uVar13;
  uint *puVar14;
  sigset_t *oset;
  sigset_t *oset_00;
  undefined4 *puVar15;
  mythread_mutex *mutex_00;
  long lVar16;
  size_t sVar17;
  bool bVar18;
  mythread_condtime wait_abs;
  lzma_vli uncompressed_size;
  lzma_vli unpadded_size;
  mythread_cond *local_148;
  mythread_mutex *local_140;
  uint8_t *local_138;
  sigset_t old;
  sigset_t all;
  
  puVar14 = &switchD_0055fdce::switchdataD_0068c5c8;
  local_138 = in;
  switch(*coder_ptr) {
  case 0:
    puVar14 = (uint *)out;
    lzma_bufcpy((uint8_t *)((long)coder_ptr + 0xe8),(size_t *)((long)coder_ptr + 0xf8),0xc,out,
                out_pos,out_size);
    if (*(ulong *)((long)coder_ptr + 0xf8) < 0xc) {
      return LZMA_OK;
    }
    *(undefined8 *)((long)coder_ptr + 0xf8) = 0;
    *(undefined4 *)coder_ptr = 1;
  case 1:
    unpadded_size = 0;
    uncompressed_size = 0;
    mutex = (mythread_mutex *)((long)coder_ptr + 0x168);
    outq = (lzma_outq *)((long)coder_ptr + 0x100);
    bVar3 = false;
    break;
  case 2:
switchD_0055fdce_caseD_2:
    lVar8 = (**(code **)((long)coder_ptr + 0x80))
                      (*(undefined8 *)((long)coder_ptr + 0x68),allocator,0,0,0,out,out_pos,out_size,
                       0);
    if (lVar8 != LZMA_STREAM_END) {
      return lVar8;
    }
    lVar12 = lzma_index_size(*(lzma_index **)((long)coder_ptr + 0x60));
    *(lzma_vli *)((long)coder_ptr + 0xb8) = lVar12;
    lVar8 = lzma_stream_footer_encode
                      ((lzma_stream_flags *)((long)coder_ptr + 0xb0),
                       (uint8_t *)((long)coder_ptr + 0xe8));
    if (lVar8 != LZMA_OK) {
      return LZMA_PROG_ERROR;
    }
    *(undefined4 *)coder_ptr = 3;
  case 3:
    lzma_bufcpy((uint8_t *)((long)coder_ptr + 0xe8),(size_t *)((long)coder_ptr + 0xf8),0xc,out,
                out_pos,out_size);
    return (uint)(0xb < *(ulong *)((long)coder_ptr + 0xf8));
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                  ,0x343,
                  "lzma_ret stream_encode_mt(void *, const lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                 );
  }
LAB_0055fe4c:
  bVar18 = true;
  lVar8 = LZMA_OK;
  do {
    if (bVar18) {
      mythread_mutex_lock(mutex);
      bVar4 = true;
      while (bVar4) {
        lVar8 = *(lzma_ret *)((long)coder_ptr + 0x134);
        if (lVar8 != LZMA_OK) {
          if (lVar8 == LZMA_STREAM_END) {
            __assert_fail("ret != LZMA_STREAM_END",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                          ,0x2be,
                          "lzma_ret stream_encode_mt(void *, const lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                         );
          }
          break;
        }
        puVar14 = (uint *)out_size;
        lVar8 = lzma_outq_read(outq,out,out_pos,out_size,&unpadded_size,&uncompressed_size);
        bVar4 = false;
      }
    }
    else {
      mythread_mutex_unlock(mutex);
      if ((lVar8 != LZMA_STREAM_END) ||
         (lVar8 = lzma_index_append(*(lzma_index **)((long)coder_ptr + 0x60),allocator,unpadded_size
                                    ,uncompressed_size), puVar14 = (uint *)out_pos,
         out_size <= *out_pos)) break;
    }
    bVar18 = (bool)(bVar18 ^ 1);
  } while( true );
  if (lVar8 == LZMA_OK) {
    do {
      sVar17 = *in_pos;
      lVar10 = *(long *)((long)coder_ptr + 0x150);
      uVar13 = (uint)puVar14;
      if (sVar17 < in_size) {
        if (lVar10 == 0) {
          lVar8 = LZMA_OK;
          if (*(uint *)((long)coder_ptr + 0x120) < *(uint *)((long)coder_ptr + 0x118)) {
            mythread_mutex_lock(mutex);
            lVar10 = *(long *)((long)coder_ptr + 0x148);
            if (lVar10 != 0) {
              *(long *)((long)coder_ptr + 0x150) = lVar10;
              *(undefined8 *)((long)coder_ptr + 0x148) = *(undefined8 *)(lVar10 + 0x158);
            }
            mythread_mutex_unlock(mutex);
            puVar15 = *(undefined4 **)((long)coder_ptr + 0x150);
            if (puVar15 == (undefined4 *)0x0) {
              if (*(uint *)((long)coder_ptr + 0x144) != *(uint *)((long)coder_ptr + 0x140)) {
                lVar10 = *(long *)((long)coder_ptr + 0x138);
                lVar16 = (ulong)*(uint *)((long)coder_ptr + 0x144) * 0x1c0;
                pvVar11 = lzma_alloc(*(size_t *)((long)coder_ptr + 8),allocator);
                *(void **)(lVar10 + 8 + lVar16) = pvVar11;
                lVar8 = LZMA_MEM_ERROR;
                if (pvVar11 != (void *)0x0) {
                  puVar15 = (undefined4 *)(lVar10 + lVar16);
                  local_140 = (mythread_mutex *)(puVar15 + 0x58);
                  iVar7 = mythread_mutex_init(local_140);
                  if (iVar7 == 0) {
                    iVar7 = mythread_cond_init((mythread_cond *)(puVar15 + 0x62));
                    if (iVar7 == 0) {
                      *puVar15 = 0;
                      *(lzma_allocator **)(puVar15 + 10) = allocator;
                      *(void **)(puVar15 + 8) = coder_ptr;
                      *(undefined8 *)(puVar15 + 0x10) = 0;
                      *(undefined8 *)(puVar15 + 0xc) = 0;
                      *(undefined8 *)(puVar15 + 0xe) = 0;
                      *(undefined8 *)(puVar15 + 0x12) = 0xffffffffffffffff;
                      *(undefined8 *)(puVar15 + 0x14) = 0;
                      *(undefined8 *)(puVar15 + 0x16) = 0;
                      *(undefined8 *)(puVar15 + 0x18) = 0;
                      *(undefined8 *)(puVar15 + 0x1a) = 0;
                      *(undefined8 *)(puVar15 + 0x1c) = 0;
                      *(undefined8 *)(puVar15 + 0x1e) = 0;
                      *(undefined8 *)(puVar15 + 0x20) = 0;
                      local_148 = (mythread_cond *)(puVar15 + 0x62);
                      sigfillset((sigset_t *)&all);
                      mythread_sigmask((int)&all,&old,oset);
                      iVar7 = pthread_create((pthread_t *)(puVar15 + 0x6e),(pthread_attr_t *)0x0,
                                             worker_start,puVar15);
                      mythread_sigmask((int)&old,(sigset_t *)0x0,oset_00);
                      if (iVar7 == 0) {
                        *(int *)((long)coder_ptr + 0x144) = *(int *)((long)coder_ptr + 0x144) + 1;
                        *(undefined4 **)((long)coder_ptr + 0x150) = puVar15;
                        goto LAB_0055ff7d;
                      }
                      mythread_cond_destroy(local_148);
                    }
                    mythread_mutex_destroy(local_140);
                  }
                  lzma_free(*(void **)(puVar15 + 2),allocator);
                  lVar8 = LZMA_MEM_ERROR;
                }
                goto LAB_0055fff9;
              }
            }
            else {
LAB_0055ff7d:
              mythread_mutex_lock((mythread_mutex *)(puVar15 + 0x58));
              puVar15 = *(undefined4 **)((long)coder_ptr + 0x150);
              *puVar15 = 1;
              *(undefined8 *)(puVar15 + 4) = 0;
              plVar9 = lzma_outq_get_buf(outq);
              lVar10 = *(long *)((long)coder_ptr + 0x150);
              *(lzma_outbuf **)(lVar10 + 0x18) = plVar9;
              mythread_cond_signal((mythread_cond *)(lVar10 + 0x188));
              mythread_mutex_unlock((mythread_mutex *)(*(long *)((long)coder_ptr + 0x150) + 0x160));
            }
            lVar8 = LZMA_OK;
          }
LAB_0055fff9:
          lVar10 = *(long *)((long)coder_ptr + 0x150);
          if (lVar10 == 0) break;
        }
      }
      else if ((action == LZMA_RUN) || (lVar10 == 0)) goto LAB_00560294;
      old.__val[0] = *(unsigned_long *)(lVar10 + 0x10);
      lzma_bufcpy(local_138,in_pos,in_size,*(uint8_t **)(lVar10 + 8),old.__val,
                  *(size_t *)((long)coder_ptr + 8));
      bVar4 = true;
      bVar18 = true;
      if (old.__val[0] != *(unsigned_long *)((long)coder_ptr + 8)) {
        bVar18 = *in_pos == in_size && action != LZMA_RUN;
      }
      bVar2 = false;
      while (mutex_00 = (mythread_mutex *)(*(long *)((long)coder_ptr + 0x150) + 0x160), bVar4) {
        mythread_mutex_lock(mutex_00);
        bVar5 = true;
        bVar4 = bVar2;
        do {
          bVar2 = bVar4;
          if (!bVar5) goto LAB_005600c1;
          piVar1 = *(int **)((long)coder_ptr + 0x150);
          bVar5 = false;
          bVar4 = true;
        } while (*piVar1 == 0);
        *(unsigned_long *)(piVar1 + 4) = old.__val[0];
        if (bVar18) {
          *piVar1 = 2;
        }
        mythread_cond_signal((mythread_cond *)(piVar1 + 0x62));
LAB_005600c1:
        bVar4 = false;
      }
      mythread_mutex_unlock(mutex_00);
      if (bVar2) {
        bVar18 = true;
        while (bVar18) {
          mythread_mutex_lock(mutex);
          uVar13 = *(uint *)((long)coder_ptr + 0x134);
          bVar18 = false;
        }
        puVar14 = (uint *)(ulong)uVar13;
        mythread_mutex_unlock(mutex);
      }
      else {
        puVar14 = (uint *)((ulong)puVar14 & 0xffffffff);
        if (bVar18) {
          *(undefined8 *)((long)coder_ptr + 0x150) = 0;
        }
      }
      lVar8 = (lzma_ret)puVar14;
    } while (!bVar2);
    if (lVar8 == LZMA_OK) {
      sVar17 = *in_pos;
LAB_00560294:
      if (sVar17 == in_size) {
        if (action == LZMA_RUN) {
          return LZMA_OK;
        }
        if (action == LZMA_FULL_BARRIER) {
          return LZMA_STREAM_END;
        }
        if (*(int *)((long)coder_ptr + 0x120) == 0) {
          if (action == LZMA_FULL_FLUSH) {
            return LZMA_STREAM_END;
          }
          if (action == LZMA_FINISH) {
            lVar8 = lzma_index_encoder_init
                              ((lzma_next_coder *)((long)coder_ptr + 0x68),allocator,
                               *(lzma_index **)((long)coder_ptr + 0x60));
            if (lVar8 != LZMA_OK) {
              return lVar8;
            }
            *(undefined4 *)coder_ptr = 2;
            lVar12 = lzma_index_size(*(lzma_index **)((long)coder_ptr + 0x60));
            *(lzma_vli *)((long)coder_ptr + 0x160) =
                 lVar12 + *(long *)((long)coder_ptr + 0x160) + 0xc;
            goto switchD_0055fdce_caseD_2;
          }
        }
      }
      if (*out_pos == out_size) {
        return LZMA_OK;
      }
      uVar13 = *(uint *)((long)coder_ptr + 0x130);
      puVar14 = (uint *)CONCAT71((int7)((ulong)out_pos >> 8),uVar13 == 0 | bVar3);
      if (uVar13 != 0 && !bVar3) {
        wait_abs.tv_sec = (ulong)uVar13 / 1000;
        wait_abs.tv_nsec = (__syscall_slong_t)((uVar13 % 1000) * 1000000);
        gettimeofday((timeval *)&old,(__timezone_ptr_t)0x0);
        wait_abs.tv_sec = wait_abs.tv_sec + old.__val[0];
        puVar14 = (uint *)(old.__val[1] * 1000 + wait_abs.tv_nsec);
        if (999999999 < (long)puVar14) {
          puVar14 = (uint *)((long)puVar14 + -1000000000);
          wait_abs.tv_sec = wait_abs.tv_sec + 1;
        }
        bVar3 = true;
        wait_abs.tv_nsec = (__syscall_slong_t)puVar14;
      }
      bVar4 = true;
      bVar18 = false;
      while (bVar4) {
        mythread_mutex_lock(mutex);
        bVar4 = true;
LAB_00560384:
        if (bVar4) {
          while ((((in_size <= sVar17 || (*(long *)((long)coder_ptr + 0x148) == 0)) ||
                  (*(uint *)((long)coder_ptr + 0x118) <= *(uint *)((long)coder_ptr + 0x120))) &&
                 (_Var6 = lzma_outq_is_readable(outq), !_Var6))) {
            bVar4 = false;
            if ((*(int *)((long)coder_ptr + 0x134) != 0) || (bVar18)) goto LAB_00560384;
            if (*(int *)((long)coder_ptr + 0x130) == 0) {
              mythread_cond_wait((mythread_cond *)
                                 &((pthread_cond_t *)((long)coder_ptr + 400))->__data,mutex);
            }
            else {
              iVar7 = pthread_cond_timedwait
                                ((pthread_cond_t *)((long)coder_ptr + 400),(pthread_mutex_t *)mutex,
                                 (timespec *)&wait_abs);
              if ((iVar7 != 0) && (iVar7 != 0x6e)) {
                __assert_fail("ret == 0 || ret == ETIMEDOUT",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                              ,0x11f,
                              "int mythread_cond_timedwait(mythread_cond *, mythread_mutex *, const mythread_condtime *)"
                             );
              }
              bVar18 = iVar7 != 0;
            }
          }
          bVar4 = false;
          goto LAB_00560384;
        }
        bVar4 = false;
      }
      mythread_mutex_unlock(mutex);
      if (bVar18) {
        return 0x20;
      }
      goto LAB_0055fe4c;
    }
  }
  threads_stop((lzma_stream_coder_conflict1 *)coder_ptr,false);
  return lVar8;
}

Assistant:

static lzma_ret
stream_encode_mt(void *coder_ptr, const lzma_allocator *allocator,
		const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size, lzma_action action)
{
	lzma_stream_coder *coder = coder_ptr;

	switch (coder->sequence) {
	case SEQ_STREAM_HEADER:
		lzma_bufcpy(coder->header, &coder->header_pos,
				sizeof(coder->header),
				out, out_pos, out_size);
		if (coder->header_pos < sizeof(coder->header))
			return LZMA_OK;

		coder->header_pos = 0;
		coder->sequence = SEQ_BLOCK;

	// Fall through

	case SEQ_BLOCK: {
		// Initialized to silence warnings.
		lzma_vli unpadded_size = 0;
		lzma_vli uncompressed_size = 0;
		lzma_ret ret = LZMA_OK;

		// These are for wait_for_work().
		bool has_blocked = false;
		mythread_condtime wait_abs;

		while (true) {
			mythread_sync(coder->mutex) {
				// Check for Block encoder errors.
				ret = coder->thread_error;
				if (ret != LZMA_OK) {
					assert(ret != LZMA_STREAM_END);
					break; // Break out of mythread_sync.
				}

				// Try to read compressed data to out[].
				ret = lzma_outq_read(&coder->outq,
						out, out_pos, out_size,
						&unpadded_size,
						&uncompressed_size);
			}

			if (ret == LZMA_STREAM_END) {
				// End of Block. Add it to the Index.
				ret = lzma_index_append(coder->index,
						allocator, unpadded_size,
						uncompressed_size);

				// If we didn't fill the output buffer yet,
				// try to read more data. Maybe the next
				// outbuf has been finished already too.
				if (*out_pos < out_size)
					continue;
			}

			if (ret != LZMA_OK) {
				// coder->thread_error was set or
				// lzma_index_append() failed.
				threads_stop(coder, false);
				return ret;
			}

			// Try to give uncompressed data to a worker thread.
			ret = stream_encode_in(coder, allocator,
					in, in_pos, in_size, action);
			if (ret != LZMA_OK) {
				threads_stop(coder, false);
				return ret;
			}

			// See if we should wait or return.
			//
			// TODO: LZMA_SYNC_FLUSH and LZMA_SYNC_BARRIER.
			if (*in_pos == in_size) {
				// LZMA_RUN: More data is probably coming
				// so return to let the caller fill the
				// input buffer.
				if (action == LZMA_RUN)
					return LZMA_OK;

				// LZMA_FULL_BARRIER: The same as with
				// LZMA_RUN but tell the caller that the
				// barrier was completed.
				if (action == LZMA_FULL_BARRIER)
					return LZMA_STREAM_END;

				// Finishing or flushing isn't completed until
				// all input data has been encoded and copied
				// to the output buffer.
				if (lzma_outq_is_empty(&coder->outq)) {
					// LZMA_FINISH: Continue to encode
					// the Index field.
					if (action == LZMA_FINISH)
						break;

					// LZMA_FULL_FLUSH: Return to tell
					// the caller that flushing was
					// completed.
					if (action == LZMA_FULL_FLUSH)
						return LZMA_STREAM_END;
				}
			}

			// Return if there is no output space left.
			// This check must be done after testing the input
			// buffer, because we might want to use a different
			// return code.
			if (*out_pos == out_size)
				return LZMA_OK;

			// Neither in nor out has been used completely.
			// Wait until there's something we can do.
			if (wait_for_work(coder, &wait_abs, &has_blocked,
					*in_pos < in_size))
				return LZMA_TIMED_OUT;
		}

		// All Blocks have been encoded and the threads have stopped.
		// Prepare to encode the Index field.
		return_if_error(lzma_index_encoder_init(
				&coder->index_encoder, allocator,
				coder->index));
		coder->sequence = SEQ_INDEX;

		// Update the progress info to take the Index and
		// Stream Footer into account. Those are very fast to encode
		// so in terms of progress information they can be thought
		// to be ready to be copied out.
		coder->progress_out += lzma_index_size(coder->index)
				+ LZMA_STREAM_HEADER_SIZE;
	}

	// Fall through

	case SEQ_INDEX: {
		// Call the Index encoder. It doesn't take any input, so
		// those pointers can be NULL.
		const lzma_ret ret = coder->index_encoder.code(
				coder->index_encoder.coder, allocator,
				NULL, NULL, 0,
				out, out_pos, out_size, LZMA_RUN);
		if (ret != LZMA_STREAM_END)
			return ret;

		// Encode the Stream Footer into coder->buffer.
		coder->stream_flags.backward_size
				= lzma_index_size(coder->index);
		if (lzma_stream_footer_encode(&coder->stream_flags,
				coder->header) != LZMA_OK)
			return LZMA_PROG_ERROR;

		coder->sequence = SEQ_STREAM_FOOTER;
	}

	// Fall through

	case SEQ_STREAM_FOOTER:
		lzma_bufcpy(coder->header, &coder->header_pos,
				sizeof(coder->header),
				out, out_pos, out_size);
		return coder->header_pos < sizeof(coder->header)
				? LZMA_OK : LZMA_STREAM_END;
	}

	assert(0);
	return LZMA_PROG_ERROR;
}